

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_load.cpp
# Opt level: O1

bool __thiscall OPNMIDIplay::LoadBank(OPNMIDIplay *this,FileAndMemReader *fr)

{
  OpnInstMeta *pOVar1;
  OpnInstMeta *pOVar2;
  undefined8 *puVar3;
  byte bVar4;
  ushort uVar5;
  OPN2 *pOVar6;
  WOPNBank *pWVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  OpnTimbre *pOVar11;
  size_t __size;
  void *mem;
  WOPNFile *pWVar12;
  long lVar13;
  uint8_t *puVar14;
  char *pcVar15;
  uint8_t *puVar16;
  ulong uVar17;
  long lVar18;
  char *pcVar19;
  long lVar20;
  uint8_t *puVar21;
  int err;
  uint16_t slots_counts [2];
  WOPNBank *slots_src_ins [2];
  int local_2818;
  uint16_t local_2814 [2];
  long local_2810;
  WOPNFile *local_2808;
  OPNMIDIplay *local_2800;
  BasicBankMap<OPN2::Bank> *local_27f8;
  ulong local_27f0;
  WOPNBank *local_27e8 [2];
  pair<BasicBankMap<OPN2::Bank>::iterator,_bool> local_27d8;
  value_type local_27b8;
  
  local_2818 = 0;
  if (fr->m_mp == (void *)0x0 && fr->m_fp == (FILE *)0x0) {
    pcVar19 = (char *)(this->errorStringOut)._M_string_length;
    pcVar15 = "Custom bank: Invalid data stream!";
  }
  else {
    __size = FileAndMemReader::fileSize(fr);
    FileAndMemReader::seek(fr,0,0);
    mem = malloc(__size);
    if (mem != (void *)0x0) {
      FileAndMemReader::read(fr,(int)mem,(void *)0x1,__size);
      pWVar12 = WOPN_LoadBankFromMem(mem,__size,&local_2818);
      free(mem);
      if (pWVar12 != (WOPNFile *)0x0) {
        pOVar6 = (this->m_synth).m_p;
        (pOVar6->m_insBankSetup).volumeModel = (uint)pWVar12->volume_model;
        bVar4 = pWVar12->lfo_freq;
        (pOVar6->m_insBankSetup).lfoEnable = bVar4 >> 3 & 1;
        (pOVar6->m_insBankSetup).lfoFrequency = bVar4 & 7;
        (pOVar6->m_insBankSetup).chipType = (uint)pWVar12->chip_type;
        (pOVar6->m_insBankSetup).mt32defaults = false;
        (this->m_setup).VolumeModel = 0;
        (this->m_setup).lfoEnable = -1;
        (this->m_setup).lfoFrequency = -1;
        (this->m_setup).chipType = -1;
        local_27f8 = &pOVar6->m_insBanks;
        local_2800 = this;
        BasicBankMap<OPN2::Bank>::clear(local_27f8);
        local_2814[0] = pWVar12->banks_count_melodic;
        local_2814[1] = pWVar12->banks_count_percussion;
        local_27e8[0] = pWVar12->banks_melodic;
        local_2808 = pWVar12;
        local_27e8[1] = pWVar12->banks_percussive;
        lVar13 = 0;
        do {
          local_2810 = lVar13;
          local_27f0 = (ulong)local_2814[lVar13];
          if ((ulong)local_2814[lVar13] != 0) {
            pWVar7 = local_27e8[lVar13];
            puVar21 = &pWVar7->ins[0].operators[0].ssgeg_90;
            uVar17 = 0;
            do {
              uVar5._0_1_ = pWVar7[uVar17].bank_midi_lsb;
              uVar5._1_1_ = pWVar7[uVar17].bank_midi_msb;
              memset(&local_27b8.second,0,0x2780);
              local_27b8.first = (ulong)uVar5 + (ulong)(lVar13 != 0) * 0x8000;
              BasicBankMap<OPN2::Bank>::insert(&local_27d8,local_27f8,&local_27b8);
              puVar14 = ((local_27d8.first.slot)->value).second.ins[0].op[0].OPS[0].data + 6;
              lVar18 = 0;
              puVar16 = puVar21;
              do {
                pOVar1 = ((local_27d8.first.slot)->value).second.ins + lVar18;
                puVar3 = (undefined8 *)
                         ((long)&((local_27d8.first.slot)->value).second.ins[lVar18].op[1].
                                 noteOffset + 1);
                *puVar3 = 0;
                puVar3[1] = 0;
                pOVar11 = ((local_27d8.first.slot)->value).second.ins[lVar18].op;
                *(undefined8 *)(pOVar11[1].OPS[2].data + 2) = 0;
                *(undefined8 *)(pOVar11[1].OPS[3].data + 3) = 0;
                pOVar11 = ((local_27d8.first.slot)->value).second.ins[lVar18].op;
                pOVar11[1].OPS[0] = (uint8_t  [7])0x0;
                pOVar11[1].OPS[1].data[0] = '\0';
                *(undefined8 *)(pOVar11[1].OPS[1].data + 1) = 0;
                pOVar11 = ((local_27d8.first.slot)->value).second.ins[lVar18].op;
                *(undefined8 *)(pOVar11->OPS[2].data + 2) = 0;
                *(undefined8 *)(pOVar11->OPS[3].data + 3) = 0;
                pOVar2 = ((local_27d8.first.slot)->value).second.ins + lVar18;
                pOVar2->op[0].OPS[0] = (uint8_t  [7])0x0;
                pOVar2->op[0].OPS[1].data[0] = '\0';
                *(undefined8 *)(pOVar2->op[0].OPS[1].data + 1) = 0;
                ((local_27d8.first.slot)->value).second.ins[lVar18].drumTone =
                     pWVar7[uVar17].ins[lVar18].percussion_key_number;
                ((local_27d8.first.slot)->value).second.ins[lVar18].flags =
                     pWVar7[uVar17].ins[lVar18].inst_flags;
                ((local_27d8.first.slot)->value).second.ins[lVar18].voice2_fine_tune = 0.0;
                ((local_27d8.first.slot)->value).second.ins[lVar18].op[0].fbalg =
                     pWVar7[uVar17].ins[lVar18].fbalg;
                ((local_27d8.first.slot)->value).second.ins[lVar18].op[0].lfosens =
                     pWVar7[uVar17].ins[lVar18].lfosens;
                ((local_27d8.first.slot)->value).second.ins[lVar18].op[0].noteOffset =
                     pWVar7[uVar17].ins[lVar18].note_offset;
                ((local_27d8.first.slot)->value).second.ins[lVar18].midiVelocityOffset =
                     pWVar7[uVar17].ins[lVar18].midi_velocity_offset;
                lVar20 = 0;
                do {
                  puVar14[lVar20 + -6] = puVar16[lVar20 + -6];
                  puVar14[lVar20 + -5] = puVar16[lVar20 + -5];
                  puVar14[lVar20 + -4] = puVar16[lVar20 + -4];
                  puVar14[lVar20 + -3] = puVar16[lVar20 + -3];
                  puVar14[lVar20 + -2] = puVar16[lVar20 + -2];
                  puVar14[lVar20 + -1] = puVar16[lVar20 + -1];
                  puVar14[lVar20] = puVar16[lVar20];
                  lVar20 = lVar20 + 7;
                } while (lVar20 != 0x1c);
                uVar8 = *(undefined8 *)pOVar1->op[0].OPS;
                uVar9 = *(undefined8 *)(pOVar1->op[0].OPS[1].data + 1);
                uVar10 = *(undefined8 *)(pOVar1->op[0].OPS[3].data + 3);
                *(undefined8 *)(pOVar1->op[1].OPS[2].data + 2) =
                     *(undefined8 *)(pOVar1->op[0].OPS[2].data + 2);
                *(undefined8 *)(pOVar1->op[1].OPS[3].data + 3) = uVar10;
                *(undefined8 *)pOVar1->op[1].OPS = uVar8;
                *(undefined8 *)(pOVar1->op[1].OPS[1].data + 1) = uVar9;
                pOVar1->soundKeyOnMs = pWVar7[uVar17].ins[lVar18].delay_on_ms;
                pOVar1->soundKeyOffMs = pWVar7[uVar17].ins[lVar18].delay_off_ms;
                lVar18 = lVar18 + 1;
                puVar14 = puVar14 + 0x4f;
                puVar16 = puVar16 + 0x48;
              } while (lVar18 != 0x80);
              uVar17 = uVar17 + 1;
              puVar21 = puVar21 + 0x2424;
            } while (uVar17 != local_27f0);
          }
          lVar13 = local_2810 + 1;
        } while (local_2810 == 0);
        applySetup(local_2800);
        WOPN_Free(local_2808);
        return true;
      }
      switch(local_2818) {
      case 1:
        pcVar19 = "Custom bank: Invalid magic!";
        break;
      case 2:
        pcVar19 = "Custom bank: Unexpected ending!";
        break;
      case 3:
        pcVar19 = "Custom bank: Invalid banks count!";
        break;
      case 4:
        pcVar19 = "Custom bank: Version is newer than supported by this library!";
        break;
      case 5:
        pcVar19 = "Custom bank: Out of memory!";
        break;
      default:
        pcVar19 = "Custom bank: Unknown error!";
      }
      std::__cxx11::string::operator=((string *)&this->errorStringOut,pcVar19);
      return false;
    }
    pcVar19 = (char *)(this->errorStringOut)._M_string_length;
    pcVar15 = "Custom bank: Out of memory before of read!";
  }
  std::__cxx11::string::_M_replace((ulong)&this->errorStringOut,0,pcVar19,(ulong)pcVar15);
  return false;
}

Assistant:

bool OPNMIDIplay::LoadBank(FileAndMemReader &fr)
{
    int err = 0;
    WOPNFile *wopn = NULL;
    char *raw_file_data = NULL;
    size_t  fsize;
    if(!fr.isValid())
    {
        errorStringOut = "Custom bank: Invalid data stream!";
        return false;
    }

    // Read complete bank file into the memory
    fsize = fr.fileSize();
    fr.seek(0, FileAndMemReader::SET);
    // Allocate necessary memory block
    raw_file_data = (char*)malloc(fsize);
    if(!raw_file_data)
    {
        errorStringOut = "Custom bank: Out of memory before of read!";
        return false;
    }
    fr.read(raw_file_data, 1, fsize);

    // Parse bank file from the memory
    wopn = WOPN_LoadBankFromMem((void*)raw_file_data, fsize, &err);
    //Free the buffer no more needed
    free(raw_file_data);

    // Check for any erros
    if(!wopn)
    {
        switch(err)
        {
        case WOPN_ERR_BAD_MAGIC:
            errorStringOut = "Custom bank: Invalid magic!";
            return false;
        case WOPN_ERR_UNEXPECTED_ENDING:
            errorStringOut = "Custom bank: Unexpected ending!";
            return false;
        case WOPN_ERR_INVALID_BANKS_COUNT:
            errorStringOut = "Custom bank: Invalid banks count!";
            return false;
        case WOPN_ERR_NEWER_VERSION:
            errorStringOut = "Custom bank: Version is newer than supported by this library!";
            return false;
        case WOPN_ERR_OUT_OF_MEMORY:
            errorStringOut = "Custom bank: Out of memory!";
            return false;
        default:
            errorStringOut = "Custom bank: Unknown error!";
            return false;
        }
    }

    Synth &synth = *m_synth;
    synth.m_insBankSetup.volumeModel = wopn->volume_model;
    synth.m_insBankSetup.lfoEnable = (wopn->lfo_freq & 8) != 0;
    synth.m_insBankSetup.lfoFrequency = wopn->lfo_freq & 7;
    synth.m_insBankSetup.chipType = wopn->chip_type;
    // FIXME: Implement the bank-side flag to enable this
    synth.m_insBankSetup.mt32defaults = false;
    m_setup.VolumeModel = OPNMIDI_VolumeModel_AUTO;
    m_setup.lfoEnable = -1;
    m_setup.lfoFrequency = -1;
    m_setup.chipType = -1;

    synth.m_insBanks.clear();

    uint16_t slots_counts[2] = {wopn->banks_count_melodic, wopn->banks_count_percussion};
    WOPNBank *slots_src_ins[2] = { wopn->banks_melodic, wopn->banks_percussive };

    for(size_t ss = 0; ss < 2; ss++)
    {
        for(size_t i = 0; i < slots_counts[ss]; i++)
        {
            size_t bankno = (slots_src_ins[ss][i].bank_midi_msb * 256) +
                            (slots_src_ins[ss][i].bank_midi_lsb) +
                            (ss ? size_t(Synth::PercussionTag) : 0);
            Synth::Bank &bank = synth.m_insBanks[bankno];
            for(int j = 0; j < 128; j++)
            {
                OpnInstMeta &ins = bank.ins[j];
                std::memset(&ins, 0, sizeof(OpnInstMeta));
                WOPNInstrument &inIns = slots_src_ins[ss][i].ins[j];
                cvt_generic_to_FMIns(ins, inIns);
            }
        }
    }

    applySetup();

    WOPN_Free(wopn);

    return true;
}